

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

baseHolder * __thiscall
cs_impl::any::holder<cs_impl::fiber::Channel<cs_impl::any>_>::duplicate
          (holder<cs_impl::fiber::Channel<cs_impl::any>_> *this)

{
  holder<cs_impl::fiber::Channel<cs_impl::any>_> *phVar1;
  
  phVar1 = cs::
           allocator_type<cs_impl::any::holder<cs_impl::fiber::Channel<cs_impl::any>>,64ul,cs_impl::default_allocator_provider>
           ::alloc<cs_impl::fiber::Channel<cs_impl::any>&>
                     ((allocator_type<cs_impl::any::holder<cs_impl::fiber::Channel<cs_impl::any>>,64ul,cs_impl::default_allocator_provider>
                       *)holder<cs_impl::fiber::Channel<cs_impl::any>>::allocator,&this->mDat);
  return &phVar1->super_baseHolder;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}